

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfChannelListAttribute.cpp
# Opt level: O1

void __thiscall
Imf_2_5::TypedAttribute<Imf_2_5::ChannelList>::writeValueTo
          (TypedAttribute<Imf_2_5::ChannelList> *this,OStream *os,int version)

{
  const_iterator cVar1;
  const_iterator cVar2;
  ConstIterator CVar3;
  int iVar4;
  ChannelList *this_00;
  undefined1 local_3e;
  undefined1 local_3d;
  _Rb_tree_color local_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  this_00 = &this->_value;
  cVar1._M_node = (_Base_ptr)ChannelList::begin(this_00);
  cVar2._M_node = (_Base_ptr)ChannelList::end(this_00);
  if (cVar1._M_node != cVar2._M_node) {
    do {
      Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(os,(char *)(cVar1._M_node + 1));
      local_3c = cVar1._M_node[9]._M_color;
      (*os->_vptr_OStream[2])(os,&local_3c,4);
      local_3e = *(undefined1 *)((long)&cVar1._M_node[9]._M_parent + 4);
      (*os->_vptr_OStream[2])(os,&local_3e,1);
      iVar4 = 3;
      do {
        local_3d = 0;
        (*os->_vptr_OStream[2])(os,&local_3d,1);
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      local_38 = *(undefined4 *)&cVar1._M_node[9].field_0x4;
      (*os->_vptr_OStream[2])(os,&local_38,4);
      local_34 = *(undefined4 *)&cVar1._M_node[9]._M_parent;
      (*os->_vptr_OStream[2])(os,&local_34,4);
      cVar1._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar1._M_node);
      CVar3 = ChannelList::end(this_00);
    } while ((const_iterator)cVar1._M_node != CVar3._i._M_node);
  }
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(os,"");
  return;
}

Assistant:

void
ChannelListAttribute::writeValueTo (OStream &os, int version) const
{
    for (ChannelList::ConstIterator i = _value.begin();
	 i != _value.end();
	 ++i)
    {
	//
	// Write name
	//

	Xdr::write <StreamIO> (os, i.name());

	//
	// Write Channel struct
	//

	Xdr::write <StreamIO> (os, int (i.channel().type));
	Xdr::write <StreamIO> (os, i.channel().pLinear);
	Xdr::pad   <StreamIO> (os, 3);
	Xdr::write <StreamIO> (os, i.channel().xSampling);
	Xdr::write <StreamIO> (os, i.channel().ySampling);
    }

    //
    // Write end of list marker
    //

    Xdr::write <StreamIO> (os, "");
}